

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O3

Token * __thiscall Tokenizer::parseHeaderKey(Token *__return_storage_ptr__,Tokenizer *this,char c)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char c_00;
  bool bVar2;
  _Optional_base<char,_true,_true> _Var3;
  long *plVar4;
  byte *pbVar5;
  TokenizerException *pTVar6;
  long *plVar7;
  size_type *psVar8;
  _Storage<char,_true> c_01;
  string res;
  string local_100;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_80;
  byte local_60 [8];
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_58;
  byte local_38 [8];
  
  paVar1 = &local_100.field_2;
  local_100._M_string_length = 0;
  local_100.field_2._M_allocated_capacity =
       local_100.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_100._M_dataplus._M_p = (pointer)paVar1;
  plVar4 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_100,0,0,'\x01');
  local_e0 = &local_d0;
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_d0 = *plVar7;
    lStack_c8 = plVar4[3];
  }
  else {
    local_d0 = *plVar7;
    local_e0 = (long *)*plVar4;
  }
  local_d8 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar1) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  _Var3._M_payload.super__Optional_payload_base<char> =
       (_Optional_payload<char,_true,_true,_true>)next(this);
  if (((ushort)_Var3._M_payload.super__Optional_payload_base<char> >> 8 & 1) == 0) {
    pTVar6 = (TokenizerException *)__cxa_allocate_exception(0x10);
    local_100._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,"Unexpected EOF when parsing HeaderKey in HeaderBlock","");
    TokenizerException::TokenizerException
              (pTVar6,&local_100,this->line_number,this->col_number,&this->current_line);
    __cxa_throw(pTVar6,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
  }
  if (_Var3._M_payload.super__Optional_payload_base<char>._M_payload == ':') {
    this->col_number = this->col_number + -1;
    this->pos = this->pos + -1;
    local_58._M_rest._0_8_ = (undefined8)((long)&local_58 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,local_e0,local_d8 + (long)local_e0);
    local_38[0] = 2;
    __return_storage_ptr__->type = HeaderKey;
    std::__detail::__variant::
    _Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
    ::_Move_ctor_base((_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                       *)&__return_storage_ptr__->value,
                      (_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                       *)&local_58._M_first);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>_&>
      ::_S_vtable._M_arr[local_38[0]]._M_data)
              ((anon_class_1_0_00000001 *)&local_100,
               (variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                *)&local_58);
    pbVar5 = local_38;
  }
  else {
    bVar2 = false;
    do {
      c_01._M_value = _Var3._M_payload.super__Optional_payload_base<char>._M_payload;
      if (bVar2) {
        c_00 = doBackslash(c_01._M_value);
        bVar2 = isValidHeaderKeyChar(c_00);
        if (!bVar2) {
          pTVar6 = (TokenizerException *)__cxa_allocate_exception(0x10);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c0,"Invalid char \"\\","");
          std::operator+(&local_a0,&local_c0,c_01._M_value);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_a0);
          local_100._M_dataplus._M_p = (pointer)*plVar4;
          psVar8 = (size_type *)(plVar4 + 2);
          if ((size_type *)local_100._M_dataplus._M_p == psVar8) {
            local_100.field_2._M_allocated_capacity = *psVar8;
            local_100.field_2._8_8_ = plVar4[3];
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          }
          else {
            local_100.field_2._M_allocated_capacity = *psVar8;
          }
          local_100._M_string_length = plVar4[1];
          *plVar4 = (long)psVar8;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          TokenizerException::TokenizerException
                    (pTVar6,&local_100,this->line_number,this->col_number,&this->current_line);
          __cxa_throw(pTVar6,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__cxx11::string::push_back((char)&local_e0);
LAB_00109353:
        bVar2 = false;
      }
      else {
        bVar2 = isValidHeaderKeyChar(c_01._M_value);
        if (!bVar2) {
          pTVar6 = (TokenizerException *)__cxa_allocate_exception(0x10);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Invalid char \"","");
          std::operator+(&local_a0,&local_c0,c_01._M_value);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_a0);
          local_100._M_dataplus._M_p = (pointer)*plVar4;
          psVar8 = (size_type *)(plVar4 + 2);
          if ((size_type *)local_100._M_dataplus._M_p == psVar8) {
            local_100.field_2._M_allocated_capacity = *psVar8;
            local_100.field_2._8_8_ = plVar4[3];
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          }
          else {
            local_100.field_2._M_allocated_capacity = *psVar8;
          }
          local_100._M_string_length = plVar4[1];
          *plVar4 = (long)psVar8;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          TokenizerException::TokenizerException
                    (pTVar6,&local_100,this->line_number,this->col_number,&this->current_line);
          __cxa_throw(pTVar6,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
        }
        bVar2 = true;
        if (c_01._M_value != '\\') {
          std::__cxx11::string::push_back((char)&local_e0);
          goto LAB_00109353;
        }
      }
      _Var3._M_payload.super__Optional_payload_base<char> =
           (_Optional_payload<char,_true,_true,_true>)next(this);
      if (((ushort)_Var3._M_payload.super__Optional_payload_base<char> >> 8 & 1) == 0) {
        pTVar6 = (TokenizerException *)__cxa_allocate_exception(0x10);
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_100,"Unexpected EOF when parsing HeaderKey in HeaderBlock","");
        TokenizerException::TokenizerException
                  (pTVar6,&local_100,this->line_number,this->col_number,&this->current_line);
        __cxa_throw(pTVar6,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
      }
    } while ((bool)(_Var3._M_payload.super__Optional_payload_base<char>._M_payload != ':' | bVar2));
    this->col_number = this->col_number + -1;
    this->pos = this->pos + -1;
    local_80._M_rest._0_8_ = (undefined8)((long)&local_80 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,local_e0,local_d8 + (long)local_e0);
    local_60[0] = 2;
    __return_storage_ptr__->type = HeaderKey;
    std::__detail::__variant::
    _Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
    ::_Move_ctor_base((_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                       *)&__return_storage_ptr__->value,
                      (_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                       *)&local_80._M_first);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>_&>
      ::_S_vtable._M_arr[local_60[0]]._M_data)
              ((anon_class_1_0_00000001 *)&local_100,
               (variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                *)&local_80);
    pbVar5 = local_60;
  }
  *pbVar5 = 0xff;
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Token Tokenizer::parseHeaderKey(char c) {
    string res = string() + c;
    optional<char> _;
    _ = next();
    if (!_.has_value()) {
        throw TokenizerException("Unexpected EOF when parsing HeaderKey in HeaderBlock", line_number, col_number, current_line);
    }
    c = _.value();
    if (c == ':') {
        unnext();
        return Token(HeaderKey, res);
    }
    bool backslash = false;
    do {
        if (backslash) {
            backslash = false;
            char slashed = doBackslash(c);
            if (!isValidHeaderKeyChar(slashed)) {
                throw TokenizerException(string("Invalid char \"\\") + c + "\" in HeaderKey", line_number, col_number,
                                         current_line);
            }
            res += slashed;
        } else {
            if (!isValidHeaderKeyChar(c)) {
                throw TokenizerException(string("Invalid char \"") + c + "\" in HeaderKey", line_number, col_number,
                                         current_line);
            }
            if (c == '\\')
                backslash = true;
            else {
                backslash = false;
                res += c;
            }
        }
        _ = next();
        if (!_.has_value()) {
            throw TokenizerException("Unexpected EOF when parsing HeaderKey in HeaderBlock", line_number, col_number,
                                     current_line);
        }
        c = _.value();
    } while (c != ':' || backslash);
    unnext();
    return Token(HeaderKey, res);
}